

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_event_epoll.c
# Opt level: O0

int mk_event_channel_destroy(mk_event_loop *loop,int r_fd,int w_fd,void *data)

{
  int iVar1;
  mk_event_ctx *ctx;
  void *data_local;
  int w_fd_local;
  int r_fd_local;
  mk_event_loop *loop_local;
  
  if (data == (void *)0x0) {
    mk_print(0x1003,"Bug found in %s() at %s:%d","mk_event_channel_destroy",
             "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_core/mk_event.c",
             199);
    abort();
  }
  iVar1 = _mk_event_channel_destroy((mk_event_ctx *)loop->data,r_fd,w_fd,data);
  return iVar1;
}

Assistant:

static inline int _mk_event_channel_destroy(struct mk_event_ctx *ctx,
                                            int r_fd, int w_fd, void *data)
{
    struct mk_event *event;
    int ret;


    event = (struct mk_event *)data;
    if (event->fd != r_fd) {
        return -1;
    }

    ret = _mk_event_del(ctx, event);
    if (ret != 0) {
        return ret;
    }

    close(r_fd);
    close(w_fd);

    return 0;
}